

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_SubDVertex * Internal_EmptyVertexInit(void)

{
  ON_SubDVertex *in_RDI;
  ON_SubDVertex *empty;
  
  ON_SubDVertex::ON_SubDVertex(in_RDI);
  memset(in_RDI,0,0x108);
  return in_RDI;
}

Assistant:

static const ON_SubDVertex Internal_EmptyVertexInit()
{
  // For efficiency, ON_SubDVertex() does not waste time
  // initializing m_limitP[], ..., m_cache_subd_P[], m_displacementV[]
  // but the offical "Empty" vertex should have every byte initialized.
  ON_SubDVertex empty;
  memset(&empty, 0, sizeof(empty));
  return empty;
}